

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O0

void __thiscall leveldb::Block::Iter::SeekToRestartPoint(Iter *this,uint32_t index)

{
  Slice local_28;
  uint32_t local_18;
  uint32_t local_14;
  uint32_t offset;
  uint32_t index_local;
  Iter *this_local;
  
  local_14 = index;
  _offset = this;
  std::__cxx11::string::clear();
  this->restart_index_ = local_14;
  local_18 = GetRestartPoint(this,local_14);
  Slice::Slice(&local_28,this->data_ + local_18,0);
  (this->value_).data_ = local_28.data_;
  (this->value_).size_ = local_28.size_;
  return;
}

Assistant:

void SeekToRestartPoint(uint32_t index) {
    key_.clear();
    restart_index_ = index;
    // current_ will be fixed by ParseNextKey();

    // ParseNextKey() starts at the end of value_, so set value_ accordingly
    uint32_t offset = GetRestartPoint(index);
    value_ = Slice(data_ + offset, 0);
  }